

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::SetLanguageStandardProperty(cmTarget *this,string *lang,string *value,string *feature)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pBVar2;
  __type _Var3;
  bool bVar4;
  mapped_type *__lhs;
  pointer __lhs_00;
  cmListFileBacktrace featureBacktrace;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_c0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_c0);
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __lhs_00 = *(pointer *)
              &((_Var1._M_head_impl)->CompileFeaturesEntries).
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  pBVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->CompileFeaturesEntries + 8);
  do {
    if (__lhs_00 == pBVar2) {
LAB_00286da9:
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      local_60.View_._M_str = (lang->_M_dataplus)._M_p;
      local_60.View_._M_len = lang->_M_string_length;
      local_90.View_._M_len = 9;
      local_90.View_._M_str = "_STANDARD";
      cmStrCat<>(&local_b0,&local_60,&local_90);
      __lhs = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&(_Var1._M_head_impl)->LanguageStandardProperties,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar4 = std::operator!=(&__lhs->Value,value);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)__lhs);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                  (&__lhs->Backtraces);
      }
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      emplace_back<cmListFileBacktrace&>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &__lhs->Backtraces,(cmListFileBacktrace *)&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
      return;
    }
    _Var3 = std::operator==(&__lhs_00->Value,feature);
    if (_Var3) {
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&local_c0,
                  (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   *)&__lhs_00->Backtrace);
      goto LAB_00286da9;
    }
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

void cmTarget::SetLanguageStandardProperty(std::string const& lang,
                                           std::string const& value,
                                           const std::string& feature)
{
  cmListFileBacktrace featureBacktrace;
  for (auto const& entry : this->impl->CompileFeaturesEntries) {
    if (entry.Value == feature) {
      featureBacktrace = entry.Backtrace;
      break;
    }
  }

  BTs<std::string>& languageStandardProperty =
    this->impl->LanguageStandardProperties[cmStrCat(lang, "_STANDARD")];
  if (languageStandardProperty.Value != value) {
    languageStandardProperty.Value = value;
    languageStandardProperty.Backtraces.clear();
  }
  languageStandardProperty.Backtraces.emplace_back(featureBacktrace);
}